

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend.cpp
# Opt level: O2

_Bool ggml_backend_sched_reserve(ggml_backend_sched_t sched,ggml_cgraph *measure_graph)

{
  _Bool _Var1;
  
  if (measure_graph->n_leafs + measure_graph->n_nodes <= (int)(sched->hash_set).size) {
    ggml_backend_sched_split_graph(sched,measure_graph);
    ggml_backend_sched_synchronize(sched);
    _Var1 = ggml_gallocr_reserve_n
                      (sched->galloc,&sched->graph,sched->node_backend_ids,sched->leaf_backend_ids);
    if (_Var1) {
      ggml_backend_sched_reset(sched);
    }
    return _Var1;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-backend.cpp"
             ,0x607,"GGML_ASSERT(%s) failed",
             "(int)sched->hash_set.size >= measure_graph->n_nodes + measure_graph->n_leafs");
}

Assistant:

bool ggml_backend_sched_reserve(ggml_backend_sched_t sched, struct ggml_cgraph * measure_graph) {
    GGML_ASSERT((int)sched->hash_set.size >= measure_graph->n_nodes + measure_graph->n_leafs);

    ggml_backend_sched_split_graph(sched, measure_graph);

    ggml_backend_sched_synchronize(sched);

    if (!ggml_gallocr_reserve_n(sched->galloc, &sched->graph, sched->node_backend_ids, sched->leaf_backend_ids)) {
        return false;
    }

    ggml_backend_sched_reset(sched);

    return true;
}